

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::setNiceAmpRampEnabled(QSynth *this,bool enabled)

{
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> local_20;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setNiceAmpRampEnabled(this->realtimeHelper,enabled);
    return;
  }
  QMutexLocker<QMutex>::QMutexLocker(&local_20,this->synthMutex);
  if (this->state == SynthState_OPEN) {
    MT32Emu::Synth::setNiceAmpRampEnabled(this->synth,enabled);
  }
  QMutexLocker<QMutex>::unlock(&local_20);
  return;
}

Assistant:

void QSynth::setNiceAmpRampEnabled(bool enabled) {
	if (isRealtime()) {
		realtimeHelper->setNiceAmpRampEnabled(enabled);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setNiceAmpRampEnabled(enabled);
	}
}